

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall google::protobuf::DescriptorProto::IsInitialized(DescriptorProto *this)

{
  bool bVar1;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *pRVar2;
  RepeatedPtrField<google::protobuf::DescriptorProto> *t;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *t_00;
  RepeatedPtrField<google::protobuf::OneofDescriptorProto> *t_01;
  DescriptorProto *this_local;
  
  pRVar2 = field(this);
  bVar1 = internal::
          AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>>
                    (pRVar2);
  if (bVar1) {
    t = nested_type(this);
    bVar1 = internal::
            AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>>
                      (t);
    if (bVar1) {
      t_00 = enum_type(this);
      bVar1 = internal::
              AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>>
                        (t_00);
      if (bVar1) {
        pRVar2 = extension(this);
        bVar1 = internal::
                AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>>
                          (pRVar2);
        if (bVar1) {
          t_01 = oneof_decl(this);
          bVar1 = internal::
                  AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>>
                            (t_01);
          if (bVar1) {
            bVar1 = has_options(this);
            if ((!bVar1) || (bVar1 = MessageOptions::IsInitialized(this->options_), bVar1)) {
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DescriptorProto::IsInitialized() const {
  if (!::google::protobuf::internal::AllAreInitialized(this->field())) return false;
  if (!::google::protobuf::internal::AllAreInitialized(this->nested_type())) return false;
  if (!::google::protobuf::internal::AllAreInitialized(this->enum_type())) return false;
  if (!::google::protobuf::internal::AllAreInitialized(this->extension())) return false;
  if (!::google::protobuf::internal::AllAreInitialized(this->oneof_decl())) return false;
  if (has_options()) {
    if (!this->options_->IsInitialized()) return false;
  }
  return true;
}